

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O3

void __thiscall minibag::LZ4Stream::stopRead(LZ4Stream *this)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->lz4s_).state != (void *)0x0) {
    roslz4_decompressEnd(&this->lz4s_);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"cannot close unopened lz4 stream","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_001506d8;
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LZ4Stream::stopRead() {
    if (!lz4s_.state) {
        throw BagException("cannot close unopened lz4 stream");
    }

    roslz4_decompressEnd(&lz4s_);
}